

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_php_doc(t_php_generator *this,ostream *out,t_function *function)

{
  t_function *out_00;
  bool bVar1;
  uint uVar2;
  t_struct *ptVar3;
  ostream *poVar4;
  reference pptVar5;
  t_type *ptVar6;
  string *psVar7;
  allocator local_301;
  string local_300;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  string local_270;
  t_field *local_250;
  t_field *exc;
  t_field **local_240;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_238
  ;
  const_iterator e_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *excs;
  t_type *local_208;
  t_type *ret_type;
  t_field *local_1e0;
  t_field *arg;
  t_field **local_1d0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1c8
  ;
  const_iterator a_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *args;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198;
  t_function *local_20;
  t_function *function_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  local_20 = function;
  function_local = (t_function *)out;
  out_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = t_doc::has_doc(&local_20->super_t_doc);
  if (bVar1) {
    psVar7 = t_doc::get_doc_abi_cxx11_(&local_20->super_t_doc);
    poVar4 = std::operator<<(&local_198,(string *)psVar7);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  ptVar3 = t_function::get_arglist(local_20);
  a_iter._M_current = (t_field **)t_struct::get_members(ptVar3);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_1c8);
  local_1d0 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(a_iter._M_current);
  local_1c8._M_current = local_1d0;
  while( true ) {
    arg = (t_field *)
          std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)a_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1c8,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&arg);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_1c8);
    local_1e0 = *pptVar5;
    poVar4 = std::operator<<(&local_198,"@param ");
    ptVar6 = t_field::get_type(local_1e0);
    type_to_phpdoc_abi_cxx11_((string *)&ret_type,this,ptVar6);
    poVar4 = std::operator<<(poVar4,(string *)&ret_type);
    poVar4 = std::operator<<(poVar4," $");
    psVar7 = t_field::get_name_abi_cxx11_(local_1e0);
    std::operator<<(poVar4,(string *)psVar7);
    std::__cxx11::string::~string((string *)&ret_type);
    bVar1 = t_doc::has_doc(&local_1e0->super_t_doc);
    if (bVar1) {
      poVar4 = std::operator<<(&local_198," ");
      psVar7 = t_doc::get_doc_abi_cxx11_(&local_1e0->super_t_doc);
      std::operator<<(poVar4,(string *)psVar7);
    }
    std::operator<<(&local_198,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_1c8);
  }
  local_208 = t_function::get_returntype(local_20);
  uVar2 = (*(local_208->super_t_doc)._vptr_t_doc[4])();
  if (((uVar2 & 1) == 0) || (bVar1 = t_doc::has_doc(&local_208->super_t_doc), bVar1)) {
    poVar4 = std::operator<<(&local_198,"@return ");
    type_to_phpdoc_abi_cxx11_((string *)&excs,this,local_208);
    std::operator<<(poVar4,(string *)&excs);
    std::__cxx11::string::~string((string *)&excs);
    bVar1 = t_doc::has_doc(&local_208->super_t_doc);
    if (bVar1) {
      poVar4 = std::operator<<(&local_198," ");
      psVar7 = t_doc::get_doc_abi_cxx11_(&local_208->super_t_doc);
      std::operator<<(poVar4,(string *)psVar7);
    }
    std::operator<<(&local_198,(string *)&::endl_abi_cxx11_);
  }
  ptVar3 = t_function::get_xceptions(local_20);
  e_iter._M_current = (t_field **)t_struct::get_members(ptVar3);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_238);
  local_240 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(e_iter._M_current);
  local_238._M_current = local_240;
  while( true ) {
    exc = (t_field *)
          std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)e_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_238,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&exc);
    out_00 = function_local;
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_238);
    local_250 = *pptVar5;
    poVar4 = std::operator<<(&local_198,"@throws ");
    ptVar6 = t_field::get_type(local_250);
    type_to_phpdoc_abi_cxx11_(&local_270,this,ptVar6);
    std::operator<<(poVar4,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    bVar1 = t_doc::has_doc(&local_250->super_t_doc);
    if (bVar1) {
      poVar4 = std::operator<<(&local_198," ");
      psVar7 = t_doc::get_doc_abi_cxx11_(&local_250->super_t_doc);
      std::operator<<(poVar4,(string *)psVar7);
    }
    std::operator<<(&local_198,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_238);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"/**\n",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8," * ",&local_2b9);
  std::__cxx11::stringstream::str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300," */\n",&local_301);
  t_generator::generate_docstring_comment
            ((t_generator *)this,(ostream *)out_00,&local_290,&local_2b8,&local_2e0,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void t_php_generator::generate_php_doc(ostream& out, t_function* function) {
  stringstream ss;
  if (function->has_doc()) {
    ss << function->get_doc() << endl;
  }

  // generate parameter types doc
  const vector<t_field*>& args = function->get_arglist()->get_members();
  vector<t_field*>::const_iterator a_iter;
  for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
    t_field* arg = *a_iter;
    ss << "@param " << type_to_phpdoc(arg->get_type()) << " $" << arg->get_name();
    if (arg->has_doc()) {
      ss << " " << arg->get_doc();
    }
    ss << endl;
  }

  // generate return type doc
  t_type* ret_type = function->get_returntype();
  if (!ret_type->is_void() || ret_type->has_doc()) {
    ss << "@return " << type_to_phpdoc(ret_type);
    if (ret_type->has_doc()) {
      ss << " " << ret_type->get_doc();
    }
    ss << endl;
  }

  // generate exceptions doc
  const vector<t_field*>& excs = function->get_xceptions()->get_members();
  vector<t_field*>::const_iterator e_iter;
  for (e_iter = excs.begin(); e_iter != excs.end(); ++e_iter) {
    t_field* exc = *e_iter;
    ss << "@throws " << type_to_phpdoc(exc->get_type());
    if (exc->has_doc()) {
      ss << " " << exc->get_doc();
    }
    ss << endl;
  }

  generate_docstring_comment(out, "/**\n", " * ", ss.str(), " */\n");
}